

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse4.c
# Opt level: O0

int aom_vector_var_sse4_1(int16_t *ref,int16_t *src,int bwl)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  byte in_DL;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  __m128i src_line2;
  __m128i ref_line;
  __m128i src_line;
  int i;
  __m128i sse;
  __m128i mean;
  __m128i k_one_epi16;
  int width;
  int local_21c;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 local_208 [16];
  undefined8 *local_1e0;
  undefined8 *local_1d8;
  short local_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  short sStack_180;
  short sStack_17e;
  short sStack_17c;
  short sStack_17a;
  short local_178;
  short sStack_176;
  short sStack_174;
  short sStack_172;
  short sStack_170;
  short sStack_16e;
  short sStack_16c;
  short sStack_16a;
  short local_168;
  short sStack_166;
  short sStack_164;
  short sStack_162;
  short sStack_160;
  short sStack_15e;
  short sStack_15c;
  short sStack_15a;
  short local_158;
  short sStack_156;
  short sStack_154;
  short sStack_152;
  short sStack_150;
  short sStack_14e;
  short sStack_14c;
  short sStack_14a;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int iStack_78;
  int iStack_74;
  int var;
  uint mean_abs;
  int sse_int;
  int mean_int;
  __m128i result;
  __m128i diff_sqr2;
  __m128i diff_sqr;
  __m128i diff2;
  __m128i diff;
  __m128i ref_line2;
  
  local_208 = ZEXT816(0);
  local_218 = 0;
  uStack_210 = 0;
  local_1e0 = in_RSI;
  local_1d8 = in_RDI;
  for (local_21c = 0; local_21c < 4 << (in_DL & 0x1f); local_21c = local_21c + 0x10) {
    uVar1 = *local_1e0;
    uVar2 = local_1e0[1];
    uVar3 = *local_1d8;
    uVar4 = local_1d8[1];
    uVar5 = local_1e0[2];
    uVar6 = local_1e0[3];
    uVar7 = local_1d8[2];
    uVar8 = local_1d8[3];
    local_158 = (short)uVar3;
    sStack_156 = (short)((ulong)uVar3 >> 0x10);
    sStack_154 = (short)((ulong)uVar3 >> 0x20);
    sStack_152 = (short)((ulong)uVar3 >> 0x30);
    sStack_150 = (short)uVar4;
    sStack_14e = (short)((ulong)uVar4 >> 0x10);
    sStack_14c = (short)((ulong)uVar4 >> 0x20);
    sStack_14a = (short)((ulong)uVar4 >> 0x30);
    local_168 = (short)uVar1;
    sStack_166 = (short)((ulong)uVar1 >> 0x10);
    sStack_164 = (short)((ulong)uVar1 >> 0x20);
    sStack_162 = (short)((ulong)uVar1 >> 0x30);
    sStack_160 = (short)uVar2;
    sStack_15e = (short)((ulong)uVar2 >> 0x10);
    sStack_15c = (short)((ulong)uVar2 >> 0x20);
    sStack_15a = (short)((ulong)uVar2 >> 0x30);
    local_158 = local_158 - local_168;
    sStack_156 = sStack_156 - sStack_166;
    sStack_154 = sStack_154 - sStack_164;
    sStack_152 = sStack_152 - sStack_162;
    sStack_150 = sStack_150 - sStack_160;
    sStack_14e = sStack_14e - sStack_15e;
    sStack_14c = sStack_14c - sStack_15c;
    sStack_14a = sStack_14a - sStack_15a;
    local_178 = (short)uVar7;
    sStack_176 = (short)((ulong)uVar7 >> 0x10);
    sStack_174 = (short)((ulong)uVar7 >> 0x20);
    sStack_172 = (short)((ulong)uVar7 >> 0x30);
    sStack_170 = (short)uVar8;
    sStack_16e = (short)((ulong)uVar8 >> 0x10);
    sStack_16c = (short)((ulong)uVar8 >> 0x20);
    sStack_16a = (short)((ulong)uVar8 >> 0x30);
    local_188 = (short)uVar5;
    sStack_186 = (short)((ulong)uVar5 >> 0x10);
    sStack_184 = (short)((ulong)uVar5 >> 0x20);
    sStack_182 = (short)((ulong)uVar5 >> 0x30);
    sStack_180 = (short)uVar6;
    sStack_17e = (short)((ulong)uVar6 >> 0x10);
    sStack_17c = (short)((ulong)uVar6 >> 0x20);
    sStack_17a = (short)((ulong)uVar6 >> 0x30);
    local_178 = local_178 - local_188;
    sStack_176 = sStack_176 - sStack_186;
    sStack_174 = sStack_174 - sStack_184;
    sStack_172 = sStack_172 - sStack_182;
    sStack_170 = sStack_170 - sStack_180;
    sStack_16e = sStack_16e - sStack_17e;
    sStack_16c = sStack_16c - sStack_17c;
    sStack_16a = sStack_16a - sStack_17a;
    auVar12._2_2_ = sStack_156;
    auVar12._0_2_ = local_158;
    auVar12._4_2_ = sStack_154;
    auVar12._6_2_ = sStack_152;
    auVar12._10_2_ = sStack_14e;
    auVar12._8_2_ = sStack_150;
    auVar12._12_2_ = sStack_14c;
    auVar12._14_2_ = sStack_14a;
    auVar11._2_2_ = sStack_156;
    auVar11._0_2_ = local_158;
    auVar11._4_2_ = sStack_154;
    auVar11._6_2_ = sStack_152;
    auVar11._10_2_ = sStack_14e;
    auVar11._8_2_ = sStack_150;
    auVar11._12_2_ = sStack_14c;
    auVar11._14_2_ = sStack_14a;
    auVar13 = pmaddwd(auVar12,auVar11);
    auVar10._2_2_ = sStack_176;
    auVar10._0_2_ = local_178;
    auVar10._4_2_ = sStack_174;
    auVar10._6_2_ = sStack_172;
    auVar10._10_2_ = sStack_16e;
    auVar10._8_2_ = sStack_170;
    auVar10._12_2_ = sStack_16c;
    auVar10._14_2_ = sStack_16a;
    auVar9._2_2_ = sStack_176;
    auVar9._0_2_ = local_178;
    auVar9._4_2_ = sStack_174;
    auVar9._6_2_ = sStack_172;
    auVar9._10_2_ = sStack_16e;
    auVar9._8_2_ = sStack_170;
    auVar9._12_2_ = sStack_16c;
    auVar9._14_2_ = sStack_16a;
    auVar14 = pmaddwd(auVar10,auVar9);
    result[1]._0_4_ = auVar13._0_4_;
    result[1]._4_4_ = auVar13._4_4_;
    diff_sqr2[0]._0_4_ = auVar13._8_4_;
    diff_sqr2[0]._4_4_ = auVar13._12_4_;
    sse_int = auVar14._0_4_;
    mean_int = auVar14._4_4_;
    result[0]._0_4_ = auVar14._8_4_;
    result[0]._4_4_ = auVar14._12_4_;
    iStack_78 = (int)local_218;
    iStack_74 = (int)((ulong)local_218 >> 0x20);
    var = (int)uStack_210;
    mean_abs = (uint)((ulong)uStack_210 >> 0x20);
    local_218 = CONCAT44(iStack_74 + result[1]._4_4_ + mean_int,iStack_78 + (int)result[1] + sse_int
                        );
    uStack_210 = CONCAT44(mean_abs + diff_sqr2[0]._4_4_ + result[0]._4_4_,
                          var + (int)diff_sqr2[0] + (int)result[0]);
    local_d8 = local_208._0_2_;
    sStack_d6 = local_208._2_2_;
    sStack_d4 = local_208._4_2_;
    sStack_d2 = local_208._6_2_;
    sStack_d0 = local_208._8_2_;
    sStack_ce = local_208._10_2_;
    sStack_cc = local_208._12_2_;
    sStack_ca = local_208._14_2_;
    local_208._2_2_ = sStack_d6 + sStack_156 + sStack_176;
    local_208._0_2_ = local_d8 + local_158 + local_178;
    local_208._4_2_ = sStack_d4 + sStack_154 + sStack_174;
    local_208._6_2_ = sStack_d2 + sStack_152 + sStack_172;
    local_208._8_2_ = sStack_d0 + sStack_150 + sStack_170;
    local_208._10_2_ = sStack_ce + sStack_14e + sStack_16e;
    local_208._12_2_ = sStack_cc + sStack_14c + sStack_16c;
    local_208._14_2_ = sStack_ca + sStack_14a + sStack_16a;
    local_1e0 = local_1e0 + 4;
    local_1d8 = local_1d8 + 4;
  }
  auVar13._8_8_ = 0x1000100010001;
  auVar13._0_8_ = 0x1000100010001;
  auVar13 = pmaddwd(local_208,auVar13);
  auVar14._8_8_ = uStack_210;
  auVar14._0_8_ = local_218;
  auVar13 = phaddd(auVar13,auVar14);
  local_98 = auVar13._0_4_;
  iStack_94 = auVar13._4_4_;
  iStack_90 = auVar13._8_4_;
  iStack_8c = auVar13._12_4_;
  local_98 = local_98 + iStack_94;
  if (local_98 < 1) {
    local_98 = -local_98;
  }
  return (iStack_90 + iStack_8c) - ((uint)(local_98 * local_98) >> (in_DL + 2 & 0x1f));
}

Assistant:

int aom_vector_var_sse4_1(const int16_t *ref, const int16_t *src, int bwl) {
  const int width = 4 << bwl;
  assert(width % 16 == 0);

  const __m128i k_one_epi16 = _mm_set1_epi16((int16_t)1);
  __m128i mean = _mm_setzero_si128();
  __m128i sse = _mm_setzero_si128();

  for (int i = 0; i < width; i += 16) {
    const __m128i src_line = _mm_loadu_si128((const __m128i *)src);
    const __m128i ref_line = _mm_loadu_si128((const __m128i *)ref);
    const __m128i src_line2 = _mm_loadu_si128((const __m128i *)(src + 8));
    const __m128i ref_line2 = _mm_loadu_si128((const __m128i *)(ref + 8));
    __m128i diff = _mm_sub_epi16(ref_line, src_line);
    const __m128i diff2 = _mm_sub_epi16(ref_line2, src_line2);
    __m128i diff_sqr = _mm_madd_epi16(diff, diff);
    const __m128i diff_sqr2 = _mm_madd_epi16(diff2, diff2);

    diff = _mm_add_epi16(diff, diff2);
    diff_sqr = _mm_add_epi32(diff_sqr, diff_sqr2);
    sse = _mm_add_epi32(sse, diff_sqr);
    mean = _mm_add_epi16(mean, diff);

    src += 16;
    ref += 16;
  }

  // m0 m1 m2 m3
  mean = _mm_madd_epi16(mean, k_one_epi16);
  // m0+m1 m2+m3 s0+s1 s2+s3
  __m128i result = _mm_hadd_epi32(mean, sse);
  // m0+m1+m2+m3 s0+s1+s2+s3 x x
  result = _mm_add_epi32(result, _mm_bsrli_si128(result, 4));

  // (mean * mean): dynamic range 31 bits.
  const int mean_int = _mm_extract_epi32(result, 0);
  const int sse_int = _mm_extract_epi32(result, 2);
  const unsigned int mean_abs = abs(mean_int);
  const int var = sse_int - ((mean_abs * mean_abs) >> (bwl + 2));
  return var;
}